

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_PackInfo(archive_read *a,_7z_pack_info *pi)

{
  int iVar1;
  uint64_t *val;
  void *pvVar2;
  char *pcVar3;
  uchar *puVar4;
  archive_read *in_RSI;
  _7z_digests *in_RDI;
  uint i;
  uchar *p;
  uint local_24;
  uint64_t *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  memset(in_RSI,0,0x30);
  iVar1 = parse_7zip_uint64(in_RSI,in_stack_ffffffffffffffe0);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = parse_7zip_uint64(in_RSI,in_stack_ffffffffffffffe0);
    if (iVar1 < 0) {
      iVar1 = -1;
    }
    else if ((in_RSI->archive).vtable == (archive_vtable_conflict *)0x0) {
      iVar1 = -1;
    }
    else if ((in_RSI->archive).vtable < (archive_vtable_conflict *)0xf4241) {
      val = (uint64_t *)
            header_bytes((archive_read *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (size_t)in_RDI);
      if (val == (uint64_t *)0x0) {
        iVar1 = -1;
      }
      else if ((uchar)*val == '\0') {
        iVar1 = 0;
      }
      else if ((uchar)*val == '\t') {
        pvVar2 = calloc((size_t)(in_RSI->archive).vtable,8);
        *(void **)&(in_RSI->archive).archive_format = pvVar2;
        pcVar3 = (char *)calloc((size_t)(in_RSI->archive).vtable,8);
        (in_RSI->archive).compression_name = pcVar3;
        if ((*(long *)&(in_RSI->archive).archive_format == 0) ||
           ((in_RSI->archive).compression_name == (char *)0x0)) {
          iVar1 = -1;
        }
        else {
          for (local_24 = 0; (archive_vtable_conflict *)(ulong)local_24 < (in_RSI->archive).vtable;
              local_24 = local_24 + 1) {
            iVar1 = parse_7zip_uint64(in_RSI,val);
            if (iVar1 < 0) {
              return -1;
            }
          }
          puVar4 = header_bytes((archive_read *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (size_t)in_RDI);
          if (puVar4 == (uchar *)0x0) {
            iVar1 = -1;
          }
          else if (*puVar4 == '\0') {
            pcVar3 = (char *)calloc((size_t)(in_RSI->archive).vtable,1);
            (in_RSI->archive).archive_format_name = pcVar3;
            pvVar2 = calloc((size_t)(in_RSI->archive).vtable,4);
            *(void **)&(in_RSI->archive).compression_code = pvVar2;
            if (((in_RSI->archive).archive_format_name == (char *)0x0) ||
               (*(long *)&(in_RSI->archive).compression_code == 0)) {
              iVar1 = -1;
            }
            else {
              iVar1 = 0;
            }
          }
          else if (*puVar4 == '\t') {
            iVar1 = read_Digests((archive_read *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,(size_t)in_RSI);
            if (iVar1 < 0) {
              iVar1 = -1;
            }
            else {
              puVar4 = header_bytes((archive_read *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (size_t)in_RDI);
              if (puVar4 == (uchar *)0x0) {
                iVar1 = -1;
              }
              else if (*puVar4 == '\0') {
                iVar1 = 0;
              }
              else {
                iVar1 = -1;
              }
            }
          }
          else {
            iVar1 = -1;
          }
        }
      }
      else {
        iVar1 = -1;
      }
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int
read_PackInfo(struct archive_read *a, struct _7z_pack_info *pi)
{
	const unsigned char *p;
	unsigned i;

	memset(pi, 0, sizeof(*pi));

	/*
	 * Read PackPos.
	 */
	if (parse_7zip_uint64(a, &(pi->pos)) < 0)
		return (-1);

	/*
	 * Read NumPackStreams.
	 */
	if (parse_7zip_uint64(a, &(pi->numPackStreams)) < 0)
		return (-1);
	if (pi->numPackStreams == 0)
		return (-1);
	if (1000000 < pi->numPackStreams)
		return (-1);

	/*
	 * Read PackSizes[num]
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kEnd)
		/* PackSizes[num] are not present. */
		return (0);
	if (*p != kSize)
		return (-1);
	pi->sizes = calloc((size_t)pi->numPackStreams, sizeof(uint64_t));
	pi->positions = calloc((size_t)pi->numPackStreams, sizeof(uint64_t));
	if (pi->sizes == NULL || pi->positions == NULL)
		return (-1);

	for (i = 0; i < pi->numPackStreams; i++) {
		if (parse_7zip_uint64(a, &(pi->sizes[i])) < 0)
			return (-1);
	}

	/*
	 * Read PackStreamDigests[num]
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kEnd) {
		/* PackStreamDigests[num] are not present. */
		pi->digest.defineds =
		    calloc((size_t)pi->numPackStreams, sizeof(*pi->digest.defineds));
		pi->digest.digests =
		    calloc((size_t)pi->numPackStreams, sizeof(*pi->digest.digests));
		if (pi->digest.defineds == NULL || pi->digest.digests == NULL)
			return (-1);
		return (0);
	}

	if (*p != kSize)
		return (-1);

	if (read_Digests(a, &(pi->digest), (size_t)pi->numPackStreams) < 0)
		return (-1);

	/*
	 *  Must be marked by kEnd.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p != kEnd)
		return (-1);
	return (0);
}